

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-alive.c
# Opt level: O3

int run_test_loop_alive(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar2;
  uv_timer_t *unaff_RBX;
  int in_ESI;
  uv_loop_t uStack_380;
  uv_timer_t *puStack_30;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(puVar2);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    unaff_RBX = &timer_handle;
    uv_timer_init(puVar2,&timer_handle);
    in_ESI = 0x160f47;
    uv_timer_start(&timer_handle,timer_cb,100,0);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 == 0) goto LAB_00160f24;
    puVar2 = uv_default_loop();
    in_ESI = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160f29;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 != 0) goto LAB_00160f2e;
    puVar2 = uv_default_loop();
    in_ESI = 0x326830;
    iVar1 = uv_queue_work(puVar2,&work_req,work_cb,after_work_cb);
    if (iVar1 != 0) goto LAB_00160f33;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 == 0) goto LAB_00160f38;
    puVar2 = uv_default_loop();
    in_ESI = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00160f3d;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_loop_alive_cold_1();
LAB_00160f24:
    run_test_loop_alive_cold_8();
LAB_00160f29:
    run_test_loop_alive_cold_2();
LAB_00160f2e:
    run_test_loop_alive_cold_3();
LAB_00160f33:
    run_test_loop_alive_cold_4();
LAB_00160f38:
    run_test_loop_alive_cold_7();
LAB_00160f3d:
    run_test_loop_alive_cold_5();
  }
  run_test_loop_alive_cold_6();
  if (puVar2 != (uv_loop_t *)0x0) {
    return extraout_EAX;
  }
  timer_cb_cold_1();
  if (puVar2 != (uv_loop_t *)0x0) {
    return extraout_EAX_00;
  }
  work_cb_cold_1();
  if (puVar2 == (uv_loop_t *)0x0) {
    after_work_cb_cold_2();
  }
  else if (in_ESI == 0) {
    return extraout_EAX_01;
  }
  after_work_cb_cold_1();
  puVar2 = &uStack_380;
  uStack_380.data = &uStack_380;
  puStack_30 = unaff_RBX;
  iVar1 = uv_loop_init(&uStack_380);
  if (iVar1 == 0) {
    if ((uv_loop_t *)uStack_380.data != &uStack_380) goto LAB_0016103e;
    puVar2 = &uStack_380;
    uv_timer_init(puVar2,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,100);
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 != -0x10) goto LAB_00161043;
    uv_run(&uStack_380,UV_RUN_DEFAULT);
    uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
    puVar2 = &uStack_380;
    iVar1 = uv_run(&uStack_380,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00161048;
    if ((uv_loop_t *)uStack_380.data != &uStack_380) goto LAB_0016104d;
    puVar2 = &uStack_380;
    iVar1 = uv_loop_close(&uStack_380);
    if (iVar1 != 0) goto LAB_00161052;
    if ((uv_loop_t *)uStack_380.data == &uStack_380) {
      return 0;
    }
  }
  else {
    run_test_loop_close_cold_1();
LAB_0016103e:
    run_test_loop_close_cold_2();
LAB_00161043:
    run_test_loop_close_cold_3();
LAB_00161048:
    run_test_loop_close_cold_4();
LAB_0016104d:
    run_test_loop_close_cold_5();
LAB_00161052:
    run_test_loop_close_cold_6();
  }
  run_test_loop_close_cold_7();
  if (puVar2 != (uv_loop_t *)0x0) {
    uv_stop(*(uv_loop_t **)&puVar2->active_handles);
    return extraout_EAX_02;
  }
  timer_cb_cold_1();
  iVar1 = uv_loop_init(&run_test_loop_instant_close::loop);
  if (iVar1 == 0) {
    iVar1 = uv_queue_work(&run_test_loop_instant_close::loop,&run_test_loop_instant_close::req,
                          loop_instant_close_work_cb,loop_instant_close_after_work_cb);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001610e8;
    }
  }
  else {
    run_test_loop_instant_close_cold_1();
  }
  run_test_loop_instant_close_cold_2();
LAB_001610e8:
  run_test_loop_instant_close_cold_3();
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(loop_alive) {
  int r;
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with handles are alive */
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with requests are alive */
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  return 0;
}